

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tradedbook.cpp
# Opt level: O0

int __thiscall hedg::Traded_Book::get_index(Traded_Book *this,float price)

{
  int t_idx;
  float price_local;
  Traded_Book *this_local;
  
  if ((price < 1.0) || (2.0 <= price)) {
    if ((price < 2.0) || (3.0 <= price)) {
      if ((price < 3.0) || (4.0 <= price)) {
        if ((price < 4.0) || (6.0 <= price)) {
          if ((price < 6.0) || (10.0 <= price)) {
            if ((price < 10.0) || (20.0 <= price)) {
              if ((price < 20.0) || (30.0 <= price)) {
                if ((price < 30.0) || (50.0 <= price)) {
                  if ((price < 50.0) || (100.0 <= price)) {
                    if ((price < 100.0) || (1000.0 <= price)) {
                      this_local._4_4_ = 0;
                    }
                    else {
                      this_local._4_4_ =
                           this->indexes[9] + -1 + (int)((price - 100.0) / this->ticks[9] + 0.5);
                    }
                  }
                  else {
                    this_local._4_4_ =
                         this->indexes[8] + -1 + (int)((price - 50.0) / this->ticks[8] + 0.5);
                  }
                }
                else {
                  this_local._4_4_ =
                       this->indexes[7] + -1 + (int)((price - 30.0) / this->ticks[7] + 0.5);
                }
              }
              else {
                this_local._4_4_ =
                     this->indexes[6] + -1 + (int)((price - 20.0) / this->ticks[6] + 0.5);
              }
            }
            else {
              this_local._4_4_ =
                   this->indexes[5] + -1 + (int)((price - 10.0) / this->ticks[5] + 0.5);
            }
          }
          else {
            this_local._4_4_ = this->indexes[4] + -1 + (int)((price - 6.0) / this->ticks[4] + 0.5);
          }
        }
        else {
          this_local._4_4_ = this->indexes[3] + -1 + (int)((price - 4.0) / this->ticks[3] + 0.5);
        }
      }
      else {
        this_local._4_4_ = this->indexes[2] + -1 + (int)((price - 3.0) / this->ticks[2] + 0.5);
      }
    }
    else {
      this_local._4_4_ = this->indexes[1] + -1 + (int)((price - 2.0) / this->ticks[1] + 0.5);
    }
  }
  else {
    this_local._4_4_ = this->indexes[0] + -1 + (int)((price - 1.01) / this->ticks[0] + 0.5);
  }
  return this_local._4_4_;
}

Assistant:

int Traded_Book::get_index(float price) {
	int t_idx = 0;
	if (1 <= price && price < 2) {
		t_idx = 0;
		return indexes[t_idx] - 1 + (int)((price - 1.01) / ticks[t_idx] + 0.5);
	}
	else if (2 <= price && price < 3) {
		t_idx = 1;
		return indexes[t_idx] - 1 + (int)((price - 2) / ticks[t_idx] + 0.5);
	}
	else if (3 <= price && price < 4) {
		t_idx = 2;
		return  indexes[t_idx] - 1 + (int)((price - 3) / ticks[t_idx] + 0.5);

	}
	else if (4 <= price && price < 6) {
		t_idx = 3;
		return indexes[t_idx] - 1 + (int)((price - 4) / ticks[t_idx] + 0.5);
	}
	else if (6 <= price && price < 10) {
		t_idx = 4;
		return  indexes[t_idx] - 1 + (int)((price - 6) / ticks[t_idx] + 0.5);
	}
	else if (10 <= price && price < 20) {
		t_idx = 5;
		return indexes[t_idx] - 1 + (int)((price - 10) / ticks[t_idx] + 0.5);
	}
	else if (20 <= price && price < 30) {
		t_idx = 6;
		return indexes[t_idx] - 1 + (int)((price - 20) / ticks[t_idx] + 0.5);

	}
	else if (30 <= price && price < 50) {
		t_idx = 7;
		return indexes[t_idx] - 1 + (int)((price - 30) / ticks[t_idx] + 0.5);
	}
	else if (50 <= price && price < 100) {
		t_idx = 8;
		return  indexes[t_idx] - 1 + (int)((price - 50) / ticks[t_idx] + 0.5);
	}
	else if (100 <= price && price < 1000) {
		t_idx = 9;
		return indexes[t_idx] - 1 + (int)((price - 100) / ticks[t_idx] + 0.5);
	}
	return 0;
}